

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

double duckdb::NoInfiniteDoubleWrapper<duckdb::ASinOperator>::Operation<double,double>(double input)

{
  InvalidInputException *this;
  OutOfRangeException *this_00;
  double dVar1;
  bool bVar2;
  string local_40;
  
  bVar2 = Value::IsFinite<double>(input);
  if (!bVar2) {
    bVar2 = Value::IsNan<double>(input);
    if (bVar2) {
      return input;
    }
    this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"input value %lf is out of range for numeric function","");
    OutOfRangeException::OutOfRangeException<double>(this_00,&local_40,input);
    __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (ABS(input) <= 1.0) {
    dVar1 = asin(input);
    return dVar1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ASIN is undefined outside [-1,1]","");
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		if (DUCKDB_UNLIKELY(!Value::IsFinite(input))) {
			if (Value::IsNan(input)) {
				return input;
			}
			throw OutOfRangeException("input value %lf is out of range for numeric function", input);
		}
		return OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input);
	}